

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturedmesh.cc
# Opt level: O1

void __thiscall
gvr::TexturedMesh::resizeVertexList(TexturedMesh *this,int vn,bool with_scanprop,bool with_scanpos)

{
  float *pfVar1;
  int iVar2;
  int iVar3;
  float *pfVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  
  iVar3 = vn * 2;
  uVar6 = 0xffffffffffffffff;
  if (-1 < vn) {
    uVar6 = (long)iVar3 << 2;
  }
  pfVar4 = (float *)operator_new__(uVar6);
  iVar5 = (this->super_Mesh).super_PointCloud.n;
  if (vn <= iVar5) {
    iVar5 = vn;
  }
  iVar2 = iVar5 * 2;
  if (0 < iVar5) {
    pfVar1 = this->uv;
    lVar7 = 1;
    do {
      pfVar4[(ulong)(iVar2 - 2) + lVar7] = pfVar1[(ulong)(iVar2 - 2) + lVar7];
      lVar7 = lVar7 + -1;
    } while (1 < iVar2 + (int)lVar7);
  }
  if (SBORROW4(iVar2,iVar3) != iVar2 + vn * -2 < 0) {
    memset(pfVar4 + iVar2,0,(ulong)((iVar3 + iVar5 * -2) - 2) * 4 + 8);
  }
  if (this->uv != (float *)0x0) {
    operator_delete__(this->uv);
  }
  this->uv = pfVar4;
  Mesh::resizeVertexList(&this->super_Mesh,vn,with_scanprop,with_scanpos);
  return;
}

Assistant:

void TexturedMesh::resizeVertexList(int vn, bool with_scanprop, bool with_scanpos)
{
  float *p=new float [2*vn];

  for (int i=2*std::min(getVertexCount(), vn)-1; i>=0; i--)
  {
    p[i]=uv[i];
  }

  for (int i=2*std::min(getVertexCount(), vn); i<2*vn; i++)
  {
    p[i]=0;
  }

  delete [] uv;

  uv=p;

  Mesh::resizeVertexList(vn, with_scanprop, with_scanpos);
}